

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O2

float __thiscall
embree::ParallelIntersectBenchmark::benchmark
          (ParallelIntersectBenchmark *this,VerifyApplication *state)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  runtime_error *this_00;
  double dVar4;
  double dVar5;
  anon_class_8_1_8991fb9c local_b0;
  anon_class_8_1_898bcfc2_conflict7 local_a8;
  task_group_context context;
  
  dVar4 = getSeconds();
  uVar1 = this->N;
  uVar2 = this->dN;
  local_b0.this = this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_a8.func = &local_b0;
  tbb::detail::d1::
  parallel_for<unsigned_long,embree::parallel_for<unsigned_long,embree::ParallelIntersectBenchmark::benchmark(embree::VerifyApplication*)::_lambda(unsigned_long)_1_>(unsigned_long,embree::ParallelIntersectBenchmark::benchmark(embree::VerifyApplication*)::_lambda(unsigned_long)_1_const&)::_lambda(unsigned_long)_1_>
            (0,(ulong)uVar1 / (ulong)uVar2,1,&local_a8,&context);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar3 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    dVar5 = getSeconds();
    return ((float)this->N * 1e-06) / (float)(dVar5 - dVar4);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float benchmark(VerifyApplication* state)
    {
      double t0 = getSeconds();
      parallel_for((size_t)N/dN, [&](size_t i) {
          render_block(i*dN, dN);
      });
      double t1 = getSeconds();
      return 1E-6f * (float)(N)/float(t1-t0);
    }